

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O1

Region * __thiscall Region::GetFirstAncestorOfNonExceptingFinallyParent(Region *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Region *pRVar4;
  bool bVar5;
  
  bVar5 = false;
  do {
    if (this->type != RegionTypeFinally) goto LAB_006279d8;
    if (this->matchingTryRegion->matchingFinallyOnNoExceptRegion != this) {
      if (this->matchingTryRegion->matchingFinallyOnNoExceptRegion != this) goto LAB_006279d8;
      break;
    }
    this = this->parent;
    bVar5 = this == (Region *)0x0;
  } while (!bVar5);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                     ,0x52,"(ancestor && !ancestor->IsNonExceptingFinally())",
                     "ancestor && !ancestor->IsNonExceptingFinally()");
  if (bVar2) {
    *puVar3 = 0;
LAB_006279d8:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                         ,0x59,"(ancestor)","ancestor");
      if (!bVar2) goto LAB_00627a7f;
      *puVar3 = 0;
      if (bVar5) {
        return (Region *)0x0;
      }
    }
    else if (((this->type != RegionTypeRoot) &&
             (pRVar4 = this->parent, pRVar4->type == RegionTypeFinally)) &&
            (pRVar4->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar4)) {
      do {
        pRVar4 = pRVar4->parent;
        if (pRVar4->type != RegionTypeFinally) {
          return pRVar4;
        }
      } while (pRVar4->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar4);
      return pRVar4;
    }
    if (this->type != RegionTypeRoot) {
      this = this->parent;
    }
    return this;
  }
LAB_00627a7f:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Region *
Region::GetFirstAncestorOfNonExceptingFinallyParent()
{
    Region * ancestor = this;
    while (ancestor && ancestor->IsNonExceptingFinally())
    {
        ancestor = ancestor->GetParent();
    }
    // ancestor is the first ancestor which is not a non exception finally
    Assert(ancestor && !ancestor->IsNonExceptingFinally());
    // If the ancestor's parent is a non exception finally, recurse
    if (ancestor && ancestor->GetType() != RegionTypeRoot && ancestor->GetParent()->IsNonExceptingFinally())
    {
        return ancestor->GetParent()->GetFirstAncestorOfNonExceptingFinally();
    }

    Assert(ancestor);
    // Null check added to avoid prefast warning only
    return ancestor ? (ancestor->GetType() == RegionTypeRoot ? ancestor : ancestor->GetParent()) : nullptr;
}